

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_RepeatedFieldMapTest_CustomIndexMapKeyComparator_Test::TestBody
          (MessageDifferencerTest_RepeatedFieldMapTest_CustomIndexMapKeyComparator_Test *this)

{
  bool bVar1;
  TestDiffMessage_Item *pTVar2;
  uint32_t *puVar3;
  Arena *pAVar4;
  FieldDescriptor *field;
  char *pcVar5;
  char *in_R9;
  AssertHelper local_448;
  Message local_440;
  undefined1 local_438 [8];
  AssertionResult gtest_ar;
  AssertHelper local_408;
  Message local_400;
  bool local_3f1;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_;
  string output;
  string local_3b8;
  MapKeyComparator local_398;
  OffsetByOneMapKeyComparator key_comparator;
  MessageDifferencer differencer;
  Item *item;
  undefined1 local_1c8 [8];
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencerTest_RepeatedFieldMapTest_CustomIndexMapKeyComparator_Test *this_local;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)((long)&msg2.field_0 + 0xa0))
  ;
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_1c8);
  pTVar2 = proto2_unittest::TestDiffMessage::add_item
                     ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  puVar3 = internal::HasBits<1>::operator[](&(pTVar2->field_0)._impl_._has_bits_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 1;
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
  internal::ArenaStringPtr::Set(&(pTVar2->field_0)._impl_.b_,"one",pAVar4);
  pTVar2 = proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)local_1c8);
  puVar3 = internal::HasBits<1>::operator[](&(pTVar2->field_0)._impl_._has_bits_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 1;
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
  internal::ArenaStringPtr::Set(&(pTVar2->field_0)._impl_.b_,"zero",pAVar4);
  pTVar2 = proto2_unittest::TestDiffMessage::add_item((TestDiffMessage *)local_1c8);
  puVar3 = internal::HasBits<1>::operator[](&(pTVar2->field_0)._impl_._has_bits_,0);
  *(byte *)puVar3 = (byte)*puVar3 | 1;
  pAVar4 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
  internal::ArenaStringPtr::Set(&(pTVar2->field_0)._impl_.b_,"one",pAVar4);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&key_comparator);
  OffsetByOneMapKeyComparator::OffsetByOneMapKeyComparator
            ((OffsetByOneMapKeyComparator *)&local_398);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"item",(allocator<char> *)(output.field_2._M_local_buf + 0xf));
  field = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0xa0),&local_3b8);
  util::MessageDifferencer::TreatAsMapUsingKeyComparator
            ((MessageDifferencer *)&key_comparator,field,&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)(output.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)&gtest_ar_.message_);
  util::MessageDifferencer::ReportDifferencesToString
            ((MessageDifferencer *)&key_comparator,(string *)&gtest_ar_.message_);
  bVar1 = util::MessageDifferencer::Compare
                    ((MessageDifferencer *)&key_comparator,(Message *)((long)&msg2.field_0 + 0xa0),
                     (Message *)local_1c8);
  local_3f1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3f0,&local_3f1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_3f0,(AssertionResult *)0x1ebd035,
               "true","false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9cc,pcVar5);
    testing::internal::AssertHelper::operator=(&local_408,&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  testing::internal::EqHelper::
  Compare<char[72],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_438,
             "\"moved: item[0] -> item[1] : { b: \\\"one\\\" }\\n\" \"added: item[0]: { b: \\\"zero\\\" }\\n\""
             ,"output",
             (char (*) [72])
             "moved: item[0] -> item[1] : { b: \"one\" }\nadded: item[0]: { b: \"zero\" }\n",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_440);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
    testing::internal::AssertHelper::AssertHelper
              (&local_448,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x9d0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_448,&local_440);
    testing::internal::AssertHelper::~AssertHelper(&local_448);
    testing::Message::~Message(&local_440);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  OffsetByOneMapKeyComparator::~OffsetByOneMapKeyComparator
            ((OffsetByOneMapKeyComparator *)&local_398);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&key_comparator);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_1c8);
  proto2_unittest::TestDiffMessage::~TestDiffMessage
            ((TestDiffMessage *)((long)&msg2.field_0 + 0xa0));
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldMapTest_CustomIndexMapKeyComparator) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  // Treat "item" as Map, using custom key comparator to determine if two
  // elements have the same key.
  proto2_unittest::TestDiffMessage::Item* item = msg1.add_item();
  item->set_b("one");
  item = msg2.add_item();
  item->set_b("zero");
  item = msg2.add_item();
  item->set_b("one");
  util::MessageDifferencer differencer;
  OffsetByOneMapKeyComparator key_comparator;
  differencer.TreatAsMapUsingKeyComparator(GetFieldDescriptor(msg1, "item"),
                                           &key_comparator);
  std::string output;
  differencer.ReportDifferencesToString(&output);
  // With the offset by one comparator msg1.item[0] should be compared to
  // msg2.item[1] and thus be moved, msg2.item[0] should be marked as added.
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "moved: item[0] -> item[1] : { b: \"one\" }\n"
      "added: item[0]: { b: \"zero\" }\n",
      output);
}